

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void kj::(anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
               (EncodingResult<kj::Array<char16_t>_> *result,char16_t (*expected) [3],bool errors)

{
  EncodingResult<kj::Array<char16_t>_> *pEVar1;
  undefined1 in_R8B;
  ArrayPtr<const_char16_t> AVar2;
  ArrayPtr<const_char16_t> expected_00;
  EncodingResult<kj::Array<char16_t>_> local_40;
  byte local_19;
  char16_t (*pacStack_18) [3];
  bool errors_local;
  char16_t (*expected_local) [3];
  EncodingResult<kj::Array<char16_t>_> *result_local;
  
  local_19 = errors;
  pacStack_18 = expected;
  expected_local = (char16_t (*) [3])result;
  pEVar1 = mv<kj::EncodingResult<kj::Array<char16_t>>>(result);
  EncodingResult<kj::Array<char16_t>_>::EncodingResult(&local_40,pEVar1);
  AVar2 = arrayPtr<char16_t_const>(*pacStack_18,2);
  expected_00.ptr = AVar2.size_;
  expected_00.size_._0_4_ = local_19 & 1;
  expected_00.size_._4_4_ = 0;
  expectResImpl<kj::Array<char16_t>,char16_t>
            ((_anonymous_namespace_ *)&local_40,(EncodingResult<kj::Array<char16_t>_> *)AVar2.ptr,
             expected_00,(bool)in_R8B);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_40);
  return;
}

Assistant:

void expectRes(EncodingResult<T> result,
               const U (&expected)[s],
               bool errors = false) {
  expectResImpl(kj::mv(result), arrayPtr(expected, s - 1), errors);
}